

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default-value.cpp
# Opt level: O0

void simple_default_values(void)

{
  char *in_RAX;
  char *unaff_retaddr;
  char *in_stack_00000008;
  char *in_stack_00000010;
  int in_stack_000040c4;
  Port *in_stack_000040c8;
  void *in_stack_000040d0;
  Ports *in_stack_000040d8;
  char *in_stack_000040e0;
  
  rtosc::get_default_value
            (in_stack_000040e0,in_stack_000040d8,in_stack_000040d0,in_stack_000040c8,
             in_stack_000040c4);
  assert_str_eq(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RAX >> 0x20));
  rtosc::get_default_value
            (in_stack_000040e0,in_stack_000040d8,in_stack_000040d0,in_stack_000040c8,
             in_stack_000040c4);
  assert_str_eq(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RAX >> 0x20));
  rtosc::get_default_value
            (in_stack_000040e0,in_stack_000040d8,in_stack_000040d0,in_stack_000040c8,
             in_stack_000040c4);
  assert_str_eq(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RAX >> 0x20));
  rtosc::get_default_value
            (in_stack_000040e0,in_stack_000040d8,in_stack_000040d0,in_stack_000040c8,
             in_stack_000040c4);
  assert_str_eq(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RAX >> 0x20));
  rtosc::get_default_value
            (in_stack_000040e0,in_stack_000040d8,in_stack_000040d0,in_stack_000040c8,
             in_stack_000040c4);
  assert_str_eq(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RAX >> 0x20));
  rtosc::get_default_value
            (in_stack_000040e0,in_stack_000040d8,in_stack_000040d0,in_stack_000040c8,
             in_stack_000040c4);
  assert_null(unaff_retaddr,in_RAX,0);
  return;
}

Assistant:

void simple_default_values()
{
    assert_str_eq(get_default_value("A", ports, NULL), "64",
                  "get integer default value", __LINE__);
    assert_str_eq(get_default_value("B0", ports, NULL), "Off",
                  "get integer array default value with options", __LINE__);
    assert_str_eq(get_default_value("B1", ports, NULL), "Off",
                  "get integer array default value with options", __LINE__);
    assert_str_eq(get_default_value("C", ports, NULL), "false",
                  "get boolean default value", __LINE__);
    assert_str_eq(get_default_value("D", ports, NULL), "1.0",
                  "get float default value", __LINE__);
    assert_null(get_default_value("E", ports, NULL),
                "get default value where there's none", __LINE__);
}